

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall Mesh::draw_mesh(Mesh *this,uint program_ID,uint zprogram,ZRender *zrender)

{
  PFNGLGETUNIFORMLOCATIONPROC p_Var1;
  PFNGLUNIFORM1FPROC p_Var2;
  PFNGLUNIFORM1IPROC p_Var3;
  bool bVar4;
  GLint GVar5;
  uint uVar6;
  int j;
  ulong uVar7;
  uint __val;
  void *pvVar8;
  undefined1 local_b8 [8];
  string texture_type;
  undefined1 local_68 [8];
  string number;
  uint local_38;
  
  (*glad_glBindVertexArray)(this->VAO);
  (*glad_glBindFramebuffer)(0x8d40,zrender->depthFBO);
  (*glad_glUseProgram)(zprogram);
  p_Var3 = glad_glUniform1i;
  GVar5 = (*glad_glGetUniformLocation)(zprogram,"zbuffer");
  pvVar8 = (void *)0x0;
  (*p_Var3)(GVar5,0);
  (*glad_glActiveTexture)(0x84c0);
  number.field_2._8_8_ = zrender;
  (*glad_glBindTexture)(0xde1,zrender->activeDepth);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->indices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->indices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) / 3; uVar7 = uVar7 + 1) {
    (*glad_glDrawElements)(4,3,0x1405,pvVar8);
    pvVar8 = (void *)((long)pvVar8 + 0xc);
  }
  (*glad_glBindFramebuffer)(0x8d40,*(GLuint *)(number.field_2._8_8_ + 0x20));
  (*glad_glUseProgram)(program_ID);
  uVar6 = 0;
  local_38 = 1;
  __val = 1;
  do {
    uVar7 = (ulong)uVar6;
    if ((ulong)(((long)(this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl
                      .super__Vector_impl_data._M_start) / 0x48) <= uVar7) {
      Render::ZRender::bindBuffers((ZRender *)number.field_2._8_8_,program_ID);
      pvVar8 = (void *)0x0;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)(this->indices).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->indices).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2) / 3;
          uVar7 = uVar7 + 1) {
        (*glad_glDrawElements)(4,3,0x1405,pvVar8);
        pvVar8 = (void *)((long)pvVar8 + 0xc);
      }
      return;
    }
    (*glad_glActiveTexture)(uVar6 + 0x84c0);
    local_68 = (undefined1  [8])&number._M_string_length;
    number._M_dataplus._M_p = (pointer)0x0;
    number._M_string_length._0_1_ = 0;
    std::__cxx11::string::string
              ((string *)local_b8,
               (string *)
               &(this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7].type);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"texture_diffuse");
    if (bVar4) {
      std::__cxx11::to_string((string *)((long)&texture_type.field_2 + 8),local_38);
      local_38 = local_38 + 1;
LAB_0011a1fa:
      std::__cxx11::string::operator=
                ((string *)local_68,(string *)(texture_type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(texture_type.field_2._M_local_buf + 8));
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"texture_specular");
      if (bVar4) {
        std::__cxx11::to_string((string *)((long)&texture_type.field_2 + 8),__val);
        __val = __val + 1;
        goto LAB_0011a1fa;
      }
    }
    p_Var2 = glad_glUniform1f;
    p_Var1 = glad_glGetUniformLocation;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&texture_type.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    GVar5 = (*p_Var1)(program_ID,(GLchar *)texture_type.field_2._8_8_);
    (*p_Var2)(GVar5,(float)uVar7);
    std::__cxx11::string::~string((string *)(texture_type.field_2._M_local_buf + 8));
    (*glad_glActiveTexture)(uVar6 + 0x84c0);
    (*glad_glBindTexture)
              (0xde1,(this->textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7].id);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_68);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Mesh::draw_mesh(unsigned int program_ID, unsigned int zprogram, Render::ZRender& zrender)
{

  glBindVertexArray(VAO);

  glBindFramebuffer(GL_FRAMEBUFFER,zrender.depthFBO);   
  glUseProgram(zprogram);
  glUniform1i(glGetUniformLocation(zprogram,"zbuffer"),0);
  glActiveTexture(GL_TEXTURE0);

  glBindTexture(GL_TEXTURE_2D,zrender.activeDepth);

  for (int j = 0; j < indices.size()/3; j++)
    glDrawElements(GL_TRIANGLES,3,GL_UNSIGNED_INT,reinterpret_cast<void*>(j*3*sizeof(unsigned int)));

  

 glBindFramebuffer(GL_FRAMEBUFFER,zrender.colorFBO);
 glUseProgram(program_ID);

   unsigned int diffuse_count = 1;
   unsigned int specular_count = 1;
   for (unsigned int i = 0; i < textures.size(); i++) {
     glActiveTexture(GL_TEXTURE0 + i); // activate proper texture unit before binding
     std::string number;
     std::string texture_type = textures[i].type;
     if (texture_type == "texture_diffuse") {
	number = std::to_string(diffuse_count++);
     } else if (texture_type == "texture_specular") {
	number = std::to_string(specular_count++);
     }

     // do I not need to use program here?
     glUniform1f(glGetUniformLocation(program_ID,
				       (texture_type + number).c_str()), i);
     glActiveTexture(GL_TEXTURE0 + i); // wait why this again?
     glBindTexture(GL_TEXTURE_2D, textures[i].id);
   }
  zrender.bindBuffers(program_ID);
  for (int j = 0; j < indices.size()/3; j++)
  {
    glDrawElements(GL_TRIANGLES,3,GL_UNSIGNED_INT,reinterpret_cast<void*>(j*3*sizeof(unsigned int)));
   }
 
}